

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall Dfa::min_Dfa(Dfa *this)

{
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *this_00;
  Fa_Node **ppFVar1;
  pointer *pppFVar2;
  pointer *ppEVar3;
  _Rb_tree_color _Var4;
  ulong *puVar5;
  pointer ppFVar6;
  _Bit_type *p_Var7;
  pointer pEVar8;
  iterator iVar9;
  void *pvVar10;
  iterator __position;
  byte bVar11;
  Fa_Node *pFVar12;
  pointer psVar13;
  pointer piVar14;
  ulong *puVar15;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_01;
  _Rb_tree_node_base *p_Var16;
  _Rb_tree_node_base *p_Var17;
  Fa_Node *pFVar18;
  uint uVar19;
  long lVar20;
  vector<bool,_std::allocator<bool>_> *__range1;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  pointer ppFVar28;
  pointer pEVar29;
  int iVar30;
  bool bVar31;
  bool bVar32;
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> new_Node;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  new_node_set;
  vector<int,_std::allocator<int>_> belong;
  int j;
  map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  mp;
  set<Edge,_std::less<Edge>,_std::allocator<Edge>_> edge_tp;
  Node_num_edge to_tp;
  set<int,_std::less<int>,_std::allocator<int>_> node_tp;
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> local_168;
  ulong local_148;
  ulong local_140;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  local_138;
  vector<int,_std::allocator<int>_> local_120;
  Edge local_108;
  _Rb_tree<Node_num_edge,_std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_f8;
  undefined1 local_c8 [8];
  _Rb_tree_node_base _Stack_c0;
  size_t local_a0;
  _Rb_tree<std::pair<char,_int>,_std::pair<char,_int>,_std::_Identity<std::pair<char,_int>_>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
  local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  std::vector<bool,_std::allocator<bool>_>::resize(&this->used,(long)this->n + 1,false);
  puVar15 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_start.super__Bit_iterator_base._M_p;
  puVar5 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar27 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if (uVar27 != 0 || puVar15 != puVar5) {
    uVar19 = 0;
    do {
      bVar11 = (byte)uVar19 & 0x3f;
      *puVar15 = *puVar15 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
      bVar31 = uVar19 == 0x3f;
      puVar15 = puVar15 + bVar31;
      uVar19 = uVar19 + 1;
      if (bVar31) {
        uVar19 = 0;
      }
    } while (uVar19 != uVar27 || puVar15 != puVar5);
  }
  bVar31 = (bool)((this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start[1]->temp ^ 1);
  ppFVar6 = (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppFVar28 = (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppFVar28 != ppFVar6; ppFVar28 = ppFVar28 + 1) {
    uVar22 = (ulong)(*ppFVar28)->n;
    uVar26 = uVar22 + 0x3f;
    if (-1 < (long)uVar22) {
      uVar26 = uVar22;
    }
    if (((this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p
         [((long)uVar26 >> 6) +
          (ulong)((uVar22 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
         (uVar22 & 0x3f) & 1) == 0) {
      dfs_del_unreachable_node(this,(*ppFVar28)->n,bVar31);
    }
  }
  this_00 = &this->Node;
  iVar30 = this->n;
  ppFVar28 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  p_Var7 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  iVar24 = 0;
  do {
    iVar25 = iVar24;
    if (0 < iVar30) {
      uVar26 = 1;
      do {
        pFVar18 = ppFVar28[uVar26];
        uVar21 = (ulong)pFVar18->n;
        uVar22 = uVar21 + 0x3f;
        if (-1 < (long)uVar21) {
          uVar22 = uVar21;
        }
        if (((p_Var7[((long)uVar22 >> 6) +
                     (ulong)((uVar21 & 0x800000000000003f) < 0x8000000000000001) +
                     0xffffffffffffffff] >> (uVar21 & 0x3f) & 1) != 0) && (pFVar18->temp != bVar31))
        {
          if (pFVar18->end == true) {
            pFVar18->temp = bVar31;
            iVar25 = iVar25 + 1;
          }
          else {
            pEVar29 = (pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              if (pEVar29 ==
                  *(pointer *)
                   ((long)&(pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl +
                   8)) goto LAB_00105385;
              ppFVar1 = &pEVar29->v;
              pEVar29 = pEVar29 + 1;
            } while ((*ppFVar1)->temp != bVar31);
            pFVar18->temp = bVar31;
            iVar25 = iVar25 + 1;
          }
        }
LAB_00105385:
        uVar26 = uVar26 + 1;
      } while (uVar26 != iVar30 + 1);
    }
    bVar32 = iVar24 == iVar25;
    iVar24 = iVar25;
    if (bVar32) {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_120,(long)this->n + 1,(allocator_type *)&local_f8);
      if (0 < this->n) {
        ppFVar28 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        lVar20 = 0;
        do {
          pFVar18 = ppFVar28[lVar20 + 1];
          if (pFVar18->temp == bVar31) {
            if (pFVar18->end == true) {
              local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar20 + 1] = 2;
            }
            else {
              local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar20 + 1] = 1;
            }
          }
          else {
            local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar20 + 1] = 0;
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < this->n);
      }
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::vector(&local_138,3,(allocator_type *)&local_f8);
      local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8._M_impl._0_8_ = 0;
      std::vector<Fa_Node*,std::allocator<Fa_Node*>>::_M_realloc_insert<Fa_Node*>
                ((vector<Fa_Node*,std::allocator<Fa_Node*>> *)&local_168,(iterator)0x0,
                 (Fa_Node **)&local_f8);
      local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_f8._M_impl.super__Rb_tree_header._M_header;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_90._M_impl.super__Rb_tree_header._M_header;
      local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right =
           local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < this->n) {
        lVar20 = 0;
        do {
          pFVar18 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar20 + 1];
          if (pFVar18->temp == bVar31) {
            lVar23 = 0x60;
            if (pFVar18->end == false) {
              lVar23 = 0x30;
            }
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       (&((local_138.
                           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 +
                       lVar23),&pFVar18->n);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < this->n);
      }
      uVar26 = 2;
      do {
        local_148 = uVar26;
        if (0 < (int)uVar26) {
          local_140 = (ulong)((int)uVar26 + 1);
          uVar22 = 1;
          do {
            std::
            _Rb_tree<Node_num_edge,_std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::clear(&local_f8);
            psVar13 = local_138.
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar22;
            p_Var16 = local_138.
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_left;
            p_Var17 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
            while (local_f8._M_impl.super__Rb_tree_header._M_header._M_left = p_Var17,
                  (_Rb_tree_header *)p_Var16 != &(psVar13->_M_t)._M_impl.super__Rb_tree_header) {
              local_108._0_4_ = p_Var16[1]._M_color;
              std::
              _Rb_tree<std::pair<char,_int>,_std::pair<char,_int>,_std::_Identity<std::pair<char,_int>_>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
              ::clear(&local_90);
              pFVar18 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl
                        .super__Vector_impl_data._M_start[(int)local_108._0_4_];
              pEVar8 = *(pointer *)
                        ((long)&(pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl + 8);
              for (pEVar29 = (pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl
                             .super__Vector_impl_data._M_start; pEVar29 != pEVar8;
                  pEVar29 = pEVar29 + 1) {
                if (pEVar29->v->temp == bVar31) {
                  local_c8[0] = pEVar29->c;
                  local_c8._4_4_ =
                       local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[pEVar29->v->n];
                  std::
                  _Rb_tree<std::pair<char,int>,std::pair<char,int>,std::_Identity<std::pair<char,int>>,std::less<std::pair<char,int>>,std::allocator<std::pair<char,int>>>
                  ::_M_insert_unique<std::pair<char,int>const&>
                            ((_Rb_tree<std::pair<char,int>,std::pair<char,int>,std::_Identity<std::pair<char,int>>,std::less<std::pair<char,int>>,std::allocator<std::pair<char,int>>>
                              *)&local_90,(pair<char,_int> *)local_c8);
                }
              }
              this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                        std::
                        map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        ::operator[]((map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                      *)&local_f8,(key_type *)&local_90);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>(this_01,(int *)&local_108);
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
              p_Var17 = local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            if ((_Rb_tree_header *)p_Var17 != &local_f8._M_impl.super__Rb_tree_header) {
              bVar32 = true;
              do {
                if (bVar32) {
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::clear(&local_138.
                           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t);
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::operator=(&local_138.
                               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar22]._M_t,
                              (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                               *)&p_Var17[2]._M_left);
                }
                else {
                  std::
                  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ::push_back(&local_138,(value_type *)&p_Var17[2]._M_left);
                  uVar26 = (ulong)((int)uVar26 + 1);
                }
                p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
                bVar32 = false;
              } while ((_Rb_tree_header *)p_Var17 != &local_f8._M_impl.super__Rb_tree_header);
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 != local_140);
        }
        piVar14 = local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        psVar13 = local_138.
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar30 = (int)uVar26;
        if (0 < iVar30) {
          uVar22 = 1;
          do {
            for (p_Var16 = psVar13[uVar22]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var16 != &psVar13[uVar22]._M_t._M_impl.super__Rb_tree_header;
                p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
              piVar14[(int)p_Var16[1]._M_color] = (int)uVar22;
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 != iVar30 + 1);
        }
      } while ((int)local_148 != iVar30);
      uVar27 = iVar30 + 1;
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::resize(&local_168,(long)(int)uVar27);
      if (0 < iVar30) {
        uVar26 = 1;
        do {
          pFVar18 = (Fa_Node *)operator_new(0x28);
          (pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pFVar18->n = (int)uVar26;
          pFVar18->start = false;
          pFVar18->end = false;
          pFVar18->temp = false;
          local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = pFVar18;
          uVar26 = uVar26 + 1;
        } while (uVar27 != uVar26);
      }
      ppFVar28 = (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppFVar28) {
        (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppFVar28;
      }
      ppFVar28 = (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppFVar28) {
        (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppFVar28;
      }
      if (0 < iVar30) {
        uVar26 = 1;
        local_148 = (ulong)uVar27;
        do {
          psVar13 = local_138.
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar26;
          local_140 = uVar26;
          for (p_Var16 = local_138.
                         super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar26]._M_t._M_impl.
                         super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var16 != &(psVar13->_M_t)._M_impl.super__Rb_tree_header;
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
            _Var4 = p_Var16[1]._M_color;
            iVar24 = local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)_Var4];
            if ((this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)_Var4]->start == true) {
              pFVar18 = local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar24];
              pFVar18->start = true;
              iVar9._M_current =
                   (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Fa_Node*,std::allocator<Fa_Node*>>::_M_realloc_insert<Fa_Node*const&>
                          ((vector<Fa_Node*,std::allocator<Fa_Node*>> *)this,iVar9,
                           local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_start + iVar24);
              }
              else {
                *iVar9._M_current = pFVar18;
                pppFVar2 = &(this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppFVar2 = *pppFVar2 + 1;
              }
            }
            if ((this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)_Var4]->end == true) {
              pFVar18 = local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar24];
              pFVar18->end = true;
              iVar9._M_current =
                   (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar9._M_current ==
                  (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Fa_Node*,std::allocator<Fa_Node*>>::_M_realloc_insert<Fa_Node*const&>
                          ((vector<Fa_Node*,std::allocator<Fa_Node*>> *)&this->end,iVar9,
                           local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_start + iVar24);
              }
              else {
                *iVar9._M_current = pFVar18;
                pppFVar2 = &(this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppFVar2 = *pppFVar2 + 1;
              }
            }
            pFVar18 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[(int)_Var4];
            pEVar8 = *(pointer *)
                      ((long)&(pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>.
                              _M_impl + 8);
            for (pEVar29 = (pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                           super__Vector_impl_data._M_start; pEVar29 != pEVar8;
                pEVar29 = pEVar29 + 1) {
              local_c8[0] = pEVar29->c;
              local_c8._1_3_ = *(undefined3 *)&pEVar29->field_0x1;
              local_c8._4_4_ = *(undefined4 *)&pEVar29->field_0x4;
              _Stack_c0._0_8_ = pEVar29->v;
              if (((Fa_Node *)_Stack_c0._0_8_)->temp == bVar31) {
                std::vector<Edge,std::allocator<Edge>>::emplace_back<Fa_Node*&,char&>
                          ((vector<Edge,std::allocator<Edge>> *)
                           &local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar24]->edge,
                           local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_start +
                           local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[((Fa_Node *)_Stack_c0._0_8_)->n],
                           local_c8);
              }
            }
          }
          uVar26 = local_140 + 1;
        } while (uVar26 != local_148);
      }
      if (0 < this->n) {
        lVar20 = 0;
        do {
          pFVar18 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar20 + 1];
          if (pFVar18 != (Fa_Node *)0x0) {
            pvVar10 = (pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (pvVar10 != (void *)0x0) {
              operator_delete(pvVar10,(long)*(pointer *)
                                             ((long)&(pFVar18->edge).
                                                     super__Vector_base<Edge,_std::allocator<Edge>_>
                                                     ._M_impl + 0x10) - (long)pvVar10);
            }
            operator_delete(pFVar18,0x28);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < this->n);
      }
      ppFVar28 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppFVar28) {
        (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppFVar28;
      }
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator=(this_00,&local_168);
      this->n = iVar30;
      _Stack_c0._0_8_ = _Stack_c0._0_8_ & 0xffffffff00000000;
      _Stack_c0._M_parent = (_Base_ptr)0x0;
      local_a0 = 0;
      _Stack_c0._M_left = &_Stack_c0;
      _Stack_c0._M_right = &_Stack_c0;
      if (0 < this->n) {
        lVar20 = 1;
        do {
          std::_Rb_tree<Edge,_Edge,_std::_Identity<Edge>,_std::less<Edge>,_std::allocator<Edge>_>::
          clear((_Rb_tree<Edge,_Edge,_std::_Identity<Edge>,_std::less<Edge>,_std::allocator<Edge>_>
                 *)local_c8);
          pFVar18 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar20];
          pEVar8 = *(pointer *)
                    ((long)&(pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl
                    + 8);
          for (pEVar29 = (pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                         super__Vector_impl_data._M_start; pEVar29 != pEVar8; pEVar29 = pEVar29 + 1)
          {
            local_108.c = pEVar29->c;
            local_108._1_7_ = *(undefined7 *)&pEVar29->field_0x1;
            local_108.v = pEVar29->v;
            std::_Rb_tree<Edge,Edge,std::_Identity<Edge>,std::less<Edge>,std::allocator<Edge>>::
            _M_insert_unique<Edge_const&>
                      ((_Rb_tree<Edge,Edge,std::_Identity<Edge>,std::less<Edge>,std::allocator<Edge>>
                        *)local_c8,&local_108);
          }
          pFVar18 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar20];
          pEVar29 = (pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                    super__Vector_impl_data._M_start;
          p_Var16 = _Stack_c0._M_left;
          if (*(pointer *)
               ((long)&(pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl + 8)
              != pEVar29) {
            *(pointer *)
             ((long)&(pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl + 8) =
                 pEVar29;
          }
          for (; p_Var16 != &_Stack_c0;
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
            local_108._0_8_ = *(undefined8 *)(p_Var16 + 1);
            local_108.v = (Fa_Node *)p_Var16[1]._M_parent;
            pFVar18 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar20];
            __position._M_current =
                 *(pointer *)
                  ((long)&(pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl +
                  8);
            if (__position._M_current ==
                *(pointer *)
                 ((long)&(pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl +
                 0x10)) {
              std::vector<Edge,std::allocator<Edge>>::_M_realloc_insert<Edge_const&>
                        ((vector<Edge,std::allocator<Edge>> *)&pFVar18->edge,__position,&local_108);
            }
            else {
              pFVar12 = (Fa_Node *)p_Var16[1]._M_parent;
              *(undefined8 *)__position._M_current = *(undefined8 *)(p_Var16 + 1);
              (__position._M_current)->v = pFVar12;
              ppEVar3 = (pointer *)
                        ((long)&(pFVar18->edge).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl + 8);
              *ppEVar3 = *ppEVar3 + 1;
            }
          }
          bVar31 = lVar20 < this->n;
          lVar20 = lVar20 + 1;
        } while (bVar31);
      }
      std::_Rb_tree<Edge,_Edge,_std::_Identity<Edge>,_std::less<Edge>,_std::allocator<Edge>_>::
      ~_Rb_tree((_Rb_tree<Edge,_Edge,_std::_Identity<Edge>,_std::less<Edge>,_std::allocator<Edge>_>
                 *)local_c8);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      std::
      _Rb_tree<std::pair<char,_int>,_std::pair<char,_int>,_std::_Identity<std::pair<char,_int>_>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<Node_num_edge,_std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_f8);
      if (local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_168.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::~vector(&local_138);
      if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void Dfa::min_Dfa() {
    used.resize(n + 1);
    for (auto i:used) {
        i = false;
    }
    //delete useless node
    bool okflag = !Node[1]->temp;
    for (auto i:begin) {//delete unreachable nodes
        if (!used[i->n]) {
            dfs_del_unreachable_node(i->n, okflag);
        }
    }

    int last_tot, tot;
    for (last_tot = -1, tot = 0; last_tot != tot;) {//delete unterminated nodes
        last_tot = tot;
        for (int k = 1; k <= n; k++) {
            auto &i = Node[k];
            if (used[i->n]) {
                if (i->temp == okflag) {
                    continue;
                }
                if (i->end) {
                    i->temp = okflag;
                    tot++;
                    continue;
                }
                for (auto j:i->edge) {
                    if (j.v->temp == okflag) {
                        i->temp = okflag;
                        tot++;
                        break;
                    }
                }
            }
        }
    }

    vector<int> belong(n + 1);
    for (int i = 1; i <= n; i++) {
        if (Node[i]->temp == okflag) {
            if (Node[i]->end) {
                belong[i] = 2;
            } else {
                belong[i] = 1;
            }
        } else {
            belong[i] = 0;
        }
    }

    vector<set<int>> new_node_set(3);
    vector<Fa_Node *> new_Node;

    new_Node.push_back(NULL);

    map<Node_num_edge, set<int>> mp;
    Node_num_edge to_tp;
    set<int> node_tp;
    //reach node set -> node set

    tot = 2;
    last_tot = 0;
    //end node set  and not end node set
    for (int i = 1; i <= n; i++) {
        if (Node[i]->temp == okflag) {
            if (Node[i]->end) {
                new_node_set[2].insert(Node[i]->n);
            } else {
                new_node_set[1].insert(Node[i]->n);
            }
        }
    }

    while (last_tot != tot) {
        last_tot = tot;
        for (int i = 1; i <= last_tot; i++) {//all node set
            mp.clear();
            //node_tp.clear();
            for (auto j:new_node_set[i]) {//every node
                to_tp.n.clear();
                for (auto k:Node[j]->edge) {//every edge
                    if (k.v->temp == okflag) {
                        pair<char, int> pair_tp(k.c, belong[k.v->n]);
                        //to_tp.n.insert(make_pair<k.c, belong[k.v->n]>);
                        to_tp.n.insert(pair_tp);
                    }
                }
                mp[to_tp].insert(j);
            }
            //update node set
            int tp_cnt = 0;
            for (const auto &j:mp) {
                if (tp_cnt == 0) {
                    new_node_set[i].clear();
                    new_node_set[i] = j.second;
                    tp_cnt++;
                } else {
                    tot++;
                    new_node_set.push_back(j.second);
                }
            }
        }
        //update belong
        for (int i = 1; i <= tot; i++) {
            for (auto j:new_node_set[i]) {
                belong[j] = i;
            }
        }
    }

    //rebuild DFA
    new_Node.resize(tot + 1);
    for (int i = 1; i <= tot; i++) {
        new_Node[i] = new Fa_Node(i);
    }

    begin.clear();
    end.clear();

    for (int q = 1; q <= tot; q++) {
        for (auto j:new_node_set[q]) {
            int i = belong[j];
            if (Node[j]->start) {
                new_Node[i]->start = true;
                begin.push_back(new_Node[i]);
            }
            if (Node[j]->end) {
                new_Node[i]->end = true;
                end.push_back(new_Node[i]);
            }
            for (auto k:Node[j]->edge) {
                if (k.v->temp == okflag) {
                    new_Node[i]->edge.emplace_back(new_Node[belong[k.v->n]], k.c);
                }
            }
        }
    }

    //delete DFA

    for (int i = 1; i <= n; i++) {
        delete Node[i];
    }

    //update DFA
    Node.clear();
    Node = new_Node;
    n = tot;

    set<Edge> edge_tp;
    //unique edges
    for (int i = 1; i <= n; i++) {
//        if (belong[i] != i) {
//            delete Node[i];
//            continue;
//        }
        edge_tp.clear();
        for (auto j:Node[i]->edge) {
            edge_tp.insert(j);
        }
        Node[i]->edge.clear();
        for (auto j:edge_tp) {
            Node[i]->edge.push_back(j);
        }
    }
}